

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O2

void __thiscall
clickhouse::Client::Impl::WriteBlock(Impl *this,Block *block,CodedOutputStream *output)

{
  bool bVar1;
  BlockInfo *pBVar2;
  size_t sVar3;
  string *value;
  ColumnRef CVar4;
  Iterator local_70;
  string local_60;
  Iterator bi;
  
  if (0xcabe < (this->server_info_).revision) {
    CodedOutputStream::WriteVarint64(output,1);
    pBVar2 = Block::Info(block);
    WireFormat::WriteFixed<unsigned_char>(output,&pBVar2->is_overflows);
    CodedOutputStream::WriteVarint64(output,2);
    pBVar2 = Block::Info(block);
    WireFormat::WriteFixed<int>(output,&pBVar2->bucket_num);
    CodedOutputStream::WriteVarint64(output,0);
  }
  sVar3 = Block::GetColumnCount(block);
  CodedOutputStream::WriteVarint64(output,sVar3);
  sVar3 = Block::GetRowCount(block);
  CodedOutputStream::WriteVarint64(output,sVar3);
  Block::Iterator::Iterator(&bi,block);
  while( true ) {
    bVar1 = Block::Iterator::IsValid(&bi);
    if (!bVar1) break;
    value = Block::Iterator::Name_abi_cxx11_(&bi);
    WireFormat::WriteString(output,value);
    Block::Iterator::Type(&local_70);
    Type::GetName_abi_cxx11_(&local_60,(Type *)local_70.block_);
    WireFormat::WriteString(output,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_70.idx_);
    CVar4 = Block::Iterator::Column((Iterator *)&local_60);
    (**(code **)(*(long *)local_60._M_dataplus._M_p + 0x20))
              (local_60._M_dataplus._M_p,output,
               CVar4.super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi._M_pi);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_60._M_string_length);
    Block::Iterator::Next(&bi);
  }
  return;
}

Assistant:

void Client::Impl::WriteBlock(const Block& block, CodedOutputStream* output) {
    // Additional information about block.
    if (server_info_.revision >= DBMS_MIN_REVISION_WITH_BLOCK_INFO) {
        WireFormat::WriteUInt64(output, 1);
        WireFormat::WriteFixed (output, block.Info().is_overflows);
        WireFormat::WriteUInt64(output, 2);
        WireFormat::WriteFixed (output, block.Info().bucket_num);
        WireFormat::WriteUInt64(output, 0);
    }

    WireFormat::WriteUInt64(output, block.GetColumnCount());
    WireFormat::WriteUInt64(output, block.GetRowCount());

    for (Block::Iterator bi(block); bi.IsValid(); bi.Next()) {
        WireFormat::WriteString(output, bi.Name());
        WireFormat::WriteString(output, bi.Type()->GetName());

        bi.Column()->Save(output);
    }
}